

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O1

bool __thiscall
StringKMerFactory::create_kmers
          (StringKMerFactory *this,string *s,
          vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
          *mers)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  int64_t *piVar3;
  byte bVar4;
  undefined8 in_RAX;
  long lVar5;
  uint64_t *__args_1;
  ulong uVar6;
  bool *__args;
  undefined1 auStack_38 [7];
  bool local_31;
  
  (this->super_KMerFactory).last_unknown = 0;
  (this->super_KMerFactory).fkmer = 0;
  (this->super_KMerFactory).rkmer = 0;
  _auStack_38 = in_RAX;
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  reserve(mers,((long)(mers->
                      super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(mers->
                      super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) + s->_M_string_length);
  if (s->_M_string_length != 0) {
    puVar1 = &(this->super_KMerFactory).fkmer;
    puVar2 = &(this->super_KMerFactory).rkmer;
    uVar6 = 0;
    do {
      bVar4 = (s->_M_dataplus)._M_p[uVar6];
      lVar5 = (long)(this->super_KMerFactory).b2f._M_elems[bVar4];
      if (lVar5 == 4) {
        (this->super_KMerFactory).last_unknown = 0;
        (this->super_KMerFactory).rkmer =
             (this->super_KMerFactory).rkmer << 2 & (this->super_KMerFactory).KMER_MASK;
        (this->super_KMerFactory).fkmer =
             (3L << ((byte)(this->super_KMerFactory).KMER_FIRSTOFFSET & 0x3f)) +
             ((this->super_KMerFactory).fkmer >> 2);
      }
      else {
        (this->super_KMerFactory).rkmer =
             lVar5 + (this->super_KMerFactory).rkmer * 4 & (this->super_KMerFactory).KMER_MASK;
        (this->super_KMerFactory).fkmer =
             ((long)(this->super_KMerFactory).b2r._M_elems[bVar4] <<
             ((byte)(this->super_KMerFactory).KMER_FIRSTOFFSET & 0x3f)) +
             ((this->super_KMerFactory).fkmer >> 2);
        piVar3 = &(this->super_KMerFactory).last_unknown;
        *piVar3 = *piVar3 + 1;
      }
      if ((long)(ulong)(this->super_KMerFactory).K <= (this->super_KMerFactory).last_unknown) {
        if (*puVar2 < *puVar1) {
          auStack_38 = (undefined1  [7])CONCAT16(0,auStack_38._0_6_);
          __args = (bool *)(auStack_38 + 6);
          __args_1 = puVar2;
        }
        else {
          _auStack_38 = CONCAT17(1,auStack_38);
          __args = (bool *)(auStack_38 + 7);
          __args_1 = puVar1;
        }
        std::vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>::
        emplace_back<bool,unsigned_long&>
                  ((vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                    *)mers,__args,__args_1);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < s->_M_string_length);
  }
  return false;
}

Assistant:

const bool create_kmers(const std::string &s, std::vector<std::pair<bool, uint64_t>> &mers) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        mers.reserve(mers.size()+s.size());
        while (p < s.size()) {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                if (fkmer <= rkmer) {
                    // Is fwd
                    mers.emplace_back(true, fkmer);
                } else {
                    // Is bwd
                    mers.emplace_back(false, rkmer);
                }
            }
        }
        return false;
    }